

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>>
::
FlatTupleBase<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5
          ,undefined8 param_6,undefined8 param_7,undefined8 param_8,undefined8 param_9,
          undefined8 param_10)

{
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,0ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_0UL>
              *)param_1,param_2);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,1ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_1UL>
              *)((long)param_1 + 0x10),param_3);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,2ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_2UL>
              *)((long)param_1 + 0x20),param_4);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,3ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_3UL>
              *)((long)param_1 + 0x30),param_5);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,4ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_4UL>
              *)((long)param_1 + 0x40),param_6);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,5ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_5UL>
              *)((long)param_1 + 0x50),param_7);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,6ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_6UL>
              *)((long)param_1 + 0x60),param_8);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,7ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_7UL>
              *)((long)param_1 + 0x70),param_9);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,8ul>
  ::FlatTupleElemBase<std::tuple<long,long>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>,_std::tuple<long,_long>_>,_8UL>
              *)((long)param_1 + 0x80),param_10);
  return;
}

Assistant:

explicit FlatTupleBase(FlatTupleConstructTag, Args&&... args)
      : FlatTupleElemBase<FlatTuple<T...>, Idx>(FlatTupleConstructTag{},
                                                std::forward<Args>(args))... {}